

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * google::protobuf::strings::Utf8SafeCEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  char *dest;
  
  src_len = (int)src->_M_string_length;
  iVar1 = src_len * 4 + 1;
  dest = (char *)operator_new__((long)iVar1);
  iVar1 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,dest,iVar1,false,true);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest,dest + iVar1);
  operator_delete__(dest);
  return __return_storage_ptr__;
}

Assistant:

std::string Utf8SafeCEscape(const std::string &src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return std::string(dest.get(), len);
}